

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int fts3PoslistMerge(char **pp,char **pp1,char **pp2)

{
  sqlite3_int64 sVar1;
  sqlite3_int64 sVar2;
  char *pcVar3;
  char *pcVar4;
  int iVar5;
  sqlite3_int64 iVal;
  int iCol;
  sqlite3_int64 *pi;
  char **ppcVar6;
  long in_FS_OFFSET;
  sqlite3_int64 iPrev;
  sqlite3_int64 i2;
  sqlite3_int64 i1;
  char *p2;
  char *p1;
  char *p;
  sqlite3_int64 local_70;
  sqlite3_int64 local_68;
  sqlite3_int64 local_60;
  int local_58;
  int local_54;
  char *local_50;
  char *local_48;
  char *local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_40 = *pp;
  local_48 = *pp1;
  local_50 = *pp2;
  do {
    pcVar4 = local_48;
    if (*local_48 == '\0') {
      if (*local_50 != '\0') {
        local_58 = -0x55555556;
        iVar5 = 0x7fffffff;
        goto LAB_001b2ece;
      }
LAB_001b303f:
      *local_40 = '\0';
      *pp = local_40 + 1;
      *pp1 = local_48 + 1;
      *pp2 = local_50 + 1;
      iVar5 = 0;
      local_40 = local_40 + 1;
      goto LAB_001b3074;
    }
    local_54 = -0x55555556;
    local_58 = -0x55555556;
    iVar5 = 0;
    if (*local_48 == '\x01') {
      iVar5 = (int)local_48[1];
      if (local_48[1] < 0) {
        sqlite3Fts3GetVarint32(local_48 + 1,&local_54);
        iVar5 = local_54;
      }
      if (iVar5 == 0) {
LAB_001b302e:
        iVar5 = 0x10b;
LAB_001b3074:
        if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
          __stack_chk_fail();
        }
        return iVar5;
      }
    }
LAB_001b2ece:
    pcVar3 = local_50;
    if (*local_50 == '\0') {
      iCol = 0x7fffffff;
    }
    else if (*local_50 == '\x01') {
      iCol = (int)local_50[1];
      if (local_50[1] < '\0') {
        sqlite3Fts3GetVarint32(local_50 + 1,&local_58);
        iCol = local_58;
      }
      if (iCol == 0) goto LAB_001b302e;
    }
    else {
      iCol = 0;
    }
    if (iVar5 == iCol) {
      local_60 = 0;
      local_68 = 0;
      local_70 = 0;
      iVar5 = fts3PutColNumber(&local_40,iVar5);
      local_48 = pcVar4 + iVar5;
      local_50 = pcVar3 + iVar5;
      fts3GetDeltaVarint(&local_48,&local_60);
      fts3GetDeltaVarint(&local_50,&local_68);
      if ((local_60 < 2) || (local_68 < 2)) goto LAB_001b303f;
      do {
        sVar2 = local_60;
        sVar1 = local_68;
        iVal = local_68;
        if (local_60 < local_68) {
          iVal = local_60;
        }
        fts3PutDeltaVarint(&local_40,&local_70,iVal);
        local_70 = local_70 + -2;
        if (sVar2 == sVar1) {
          fts3ReadNextPos(&local_48,&local_60);
LAB_001b2fbc:
          pi = &local_68;
          ppcVar6 = &local_50;
        }
        else {
          if (sVar1 <= sVar2) goto LAB_001b2fbc;
          pi = &local_60;
          ppcVar6 = &local_48;
        }
        fts3ReadNextPos(ppcVar6,pi);
      } while (local_68 != 0x7fffffffffffffff || local_60 != 0x7fffffffffffffff);
    }
    else {
      if (iVar5 < iCol) {
        iVar5 = fts3PutColNumber(&local_40,iVar5);
        local_48 = pcVar4 + iVar5;
        ppcVar6 = &local_48;
      }
      else {
        iVar5 = fts3PutColNumber(&local_40,iCol);
        local_50 = pcVar3 + iVar5;
        ppcVar6 = &local_50;
      }
      fts3ColumnlistCopy(&local_40,ppcVar6);
    }
  } while( true );
}

Assistant:

static int fts3PoslistMerge(
  char **pp,                      /* Output buffer */
  char **pp1,                     /* Left input list */
  char **pp2                      /* Right input list */
){
  char *p = *pp;
  char *p1 = *pp1;
  char *p2 = *pp2;

  while( *p1 || *p2 ){
    int iCol1;         /* The current column index in pp1 */
    int iCol2;         /* The current column index in pp2 */

    if( *p1==POS_COLUMN ){
      fts3GetVarint32(&p1[1], &iCol1);
      if( iCol1==0 ) return FTS_CORRUPT_VTAB;
    }
    else if( *p1==POS_END ) iCol1 = 0x7fffffff;
    else iCol1 = 0;

    if( *p2==POS_COLUMN ){
      fts3GetVarint32(&p2[1], &iCol2);
      if( iCol2==0 ) return FTS_CORRUPT_VTAB;
    }
    else if( *p2==POS_END ) iCol2 = 0x7fffffff;
    else iCol2 = 0;

    if( iCol1==iCol2 ){
      sqlite3_int64 i1 = 0;       /* Last position from pp1 */
      sqlite3_int64 i2 = 0;       /* Last position from pp2 */
      sqlite3_int64 iPrev = 0;
      int n = fts3PutColNumber(&p, iCol1);
      p1 += n;
      p2 += n;

      /* At this point, both p1 and p2 point to the start of column-lists
      ** for the same column (the column with index iCol1 and iCol2).
      ** A column-list is a list of non-negative delta-encoded varints, each
      ** incremented by 2 before being stored. Each list is terminated by a
      ** POS_END (0) or POS_COLUMN (1). The following block merges the two lists
      ** and writes the results to buffer p. p is left pointing to the byte
      ** after the list written. No terminator (POS_END or POS_COLUMN) is
      ** written to the output.
      */
      fts3GetDeltaVarint(&p1, &i1);
      fts3GetDeltaVarint(&p2, &i2);
      if( i1<2 || i2<2 ){
        break;
      }
      do {
        fts3PutDeltaVarint(&p, &iPrev, (i1<i2) ? i1 : i2);
        iPrev -= 2;
        if( i1==i2 ){
          fts3ReadNextPos(&p1, &i1);
          fts3ReadNextPos(&p2, &i2);
        }else if( i1<i2 ){
          fts3ReadNextPos(&p1, &i1);
        }else{
          fts3ReadNextPos(&p2, &i2);
        }
      }while( i1!=POSITION_LIST_END || i2!=POSITION_LIST_END );
    }else if( iCol1<iCol2 ){
      p1 += fts3PutColNumber(&p, iCol1);
      fts3ColumnlistCopy(&p, &p1);
    }else{
      p2 += fts3PutColNumber(&p, iCol2);
      fts3ColumnlistCopy(&p, &p2);
    }
  }

  *p++ = POS_END;
  *pp = p;
  *pp1 = p1 + 1;
  *pp2 = p2 + 1;
  return SQLITE_OK;
}